

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::
SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderClearFailedDuringFrameRendering_Test::TestBody
          (SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderClearFailedDuringFrameRendering_Test
           *this)

{
  bool bVar1;
  WrapperMock *pWVar2;
  MockSpec<void_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
  *this_00;
  MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
  *this_01;
  TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
  *this_02;
  char *message;
  AssertHelper local_140;
  Message local_138 [2];
  runtime_error *anon_var_0;
  type e;
  undefined1 auStack_f8 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
  local_c8;
  WithoutMatchers local_a1;
  SDL_Renderer_conflict *local_a0;
  Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&> local_98;
  MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
  local_80;
  WithoutMatchers local_5d [13];
  SDL_Renderer_conflict *local_50;
  Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&> local_48;
  MockSpec<void_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
  local_30;
  SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderClearFailedDuringFrameRendering_Test *local_10;
  SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderClearFailedDuringFrameRendering_Test
  *this_local;
  
  local_10 = this;
  pWVar2 = &mock_ptr<testing::StrictMock<solitaire::SDL::WrapperMock>_>::operator*
                      (&(this->super_SDLGraphicsSystemWithLoadedTexture).
                        super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.
                        sdlMock)->super_WrapperMock;
  local_50 = (SDL_Renderer_conflict *)
             testing::no_adl::Pointer<SDL_Renderer*>
                       ((Snapshot **)&(anonymous_namespace)::rendererPtr);
  testing::internal::PointerMatcher::operator_cast_to_Matcher(&local_48,(PointerMatcher *)&local_50)
  ;
  SDL::WrapperMock::gmock_renderPresent(&local_30,pWVar2,&local_48);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<void_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
            ::operator()(&local_30,local_5d,(void *)0x0);
  testing::internal::
  MockSpec<void_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>::
  InternalExpectedAt(this_00,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                     ,0x193,"*sdlMock","renderPresent(Pointer(rendererPtr))");
  testing::internal::
  MockSpec<void_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>::
  ~MockSpec(&local_30);
  testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~Matcher(&local_48);
  pWVar2 = &mock_ptr<testing::StrictMock<solitaire::SDL::WrapperMock>_>::operator*
                      (&(this->super_SDLGraphicsSystemWithLoadedTexture).
                        super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.
                        sdlMock)->super_WrapperMock;
  local_a0 = (SDL_Renderer_conflict *)
             testing::no_adl::Pointer<SDL_Renderer*>
                       ((Snapshot **)&(anonymous_namespace)::rendererPtr);
  testing::internal::PointerMatcher::operator_cast_to_Matcher(&local_98,(PointerMatcher *)&local_a0)
  ;
  SDL::WrapperMock::gmock_renderClear(&local_80,pWVar2,&local_98);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
            ::operator()(&local_80,&local_a1,(void *)0x0);
  this_02 = testing::internal::
            MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
            ::InternalExpectedAt
                      (this_01,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x194,"*sdlMock","renderClear(Pointer(rendererPtr))");
  testing::Return<int>((testing *)(gtest_msg.value.field_2._M_local_buf + 8),-1);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_c8,(ReturnAction *)(gtest_msg.value.field_2._M_local_buf + 8));
  testing::internal::
  TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
  ::WillOnce(this_02,&local_c8);
  testing::
  Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>::
  ~Action(&local_c8);
  testing::internal::ReturnAction<int>::~ReturnAction
            ((ReturnAction<int> *)((long)&gtest_msg.value.field_2 + 8));
  testing::internal::
  MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>::
  ~MockSpec(&local_80);
  testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~Matcher(&local_98);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_f8[0] = (_Alloc_hider)0x0;
  stack0xffffffffffffff09 = 0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_f8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_f8);
  if (bVar1) {
    e._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      SDLGraphicsSystem::renderFrame
                (&(this->super_SDLGraphicsSystemWithLoadedTexture).
                  super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.system)
      ;
    }
    if ((e._7_1_ & 1) != 0) goto LAB_002d7839;
    std::__cxx11::string::operator=
              ((string *)auStack_f8,
               "Expected: system.renderFrame() throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_138);
  message = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_140,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x195,message);
  testing::internal::AssertHelper::operator=(&local_140,local_138);
  testing::internal::AssertHelper::~AssertHelper(&local_140);
  testing::Message::~Message(local_138);
LAB_002d7839:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_f8);
  SDLGraphicsSystemWithLoadedTexture::expectQuitSystemWithLoadedTexture
            (&this->super_SDLGraphicsSystemWithLoadedTexture);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithLoadedTexture,
       throwIfSDLRenderClearFailedDuringFrameRendering)
{
    EXPECT_CALL(*sdlMock, renderPresent(Pointer(rendererPtr)));
    EXPECT_CALL(*sdlMock, renderClear(Pointer(rendererPtr))).WillOnce(Return(failure));
    EXPECT_THROW(system.renderFrame(), std::runtime_error);
    expectQuitSystemWithLoadedTexture();
}